

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void Ifn_NtkAddConstrOne(sat_solver *pSat,Vec_Int_t *vCover,int *pVars,int nVars)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int pLits [11];
  lit local_68 [14];
  
  if (0 < vCover->nSize) {
    lVar6 = 0;
    do {
      if (nVars < 1) {
        lVar2 = 0;
      }
      else {
        iVar1 = vCover->pArray[lVar6];
        lVar2 = 0;
        iVar3 = 0;
        do {
          switch(iVar1 >> ((byte)lVar2 & 0x1f) & 3) {
          case 0:
            goto switchD_0043c7e7_caseD_0;
          case 1:
            iVar4 = *(int *)((long)pVars + lVar2 * 2);
            if (iVar4 < 0) {
LAB_0043c853:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            iVar4 = iVar4 * 2;
            break;
          case 2:
            iVar4 = *(int *)((long)pVars + lVar2 * 2);
            if (iVar4 < 0) goto LAB_0043c853;
            iVar4 = iVar4 * 2 + 1;
            break;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                          ,0x417,"void Ifn_NtkAddConstrOne(sat_solver *, Vec_Int_t *, int *, int)");
          }
          lVar5 = (long)iVar3;
          iVar3 = iVar3 + 1;
          local_68[lVar5] = iVar4;
switchD_0043c7e7_caseD_0:
          lVar2 = lVar2 + 2;
        } while ((ulong)(uint)nVars * 2 != lVar2);
        lVar2 = (long)iVar3;
      }
      iVar1 = sat_solver_addclause(pSat,local_68,local_68 + lVar2);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x41a,"void Ifn_NtkAddConstrOne(sat_solver *, Vec_Int_t *, int *, int)");
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vCover->nSize);
  }
  return;
}

Assistant:

void Ifn_NtkAddConstrOne( sat_solver * pSat, Vec_Int_t * vCover, int * pVars, int nVars )
{
    int RetValue, k, c, Cube, Literal, nLits, pLits[IFN_INS];
    Vec_IntForEachEntry( vCover, Cube, c )
    {
        nLits = 0;
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Cube >> (k << 1));
            if ( Literal == 1 )      // '0'  -> pos lit
                pLits[nLits++] = Abc_Var2Lit(pVars[k], 0);
            else if ( Literal == 2 ) // '1'  -> neg lit
                pLits[nLits++] = Abc_Var2Lit(pVars[k], 1);
            else if ( Literal != 0 )
                assert( 0 );
        }
        RetValue = Ifn_AddClause( pSat, pLits, pLits + nLits );
        assert( RetValue );
    }
}